

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O1

void spell_hydroperception(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  char *txt;
  AFFECT_DATA af;
  AFFECT_DATA AStack_88;
  
  bVar1 = is_affected(ch,sn);
  if (bVar1) {
    txt = "Your eyes are already accommodated to seeing in water.\n\r";
  }
  else {
    init_affect(&AStack_88);
    AStack_88.where = 0;
    AStack_88.aftype = get_spell_aftype(ch);
    AStack_88.type = (short)sn;
    AStack_88.level = (short)level;
    AStack_88.duration = (short)((uint)(level - (level >> 0x1f)) >> 1);
    AStack_88.location = 0;
    AStack_88.modifier = 0;
    AStack_88.mod_name = 0xb;
    affect_to_char(ch,&AStack_88);
    txt = "You focus your senses on changes in the water around you.\n\r";
  }
  send_to_char(txt,ch);
  return;
}

Assistant:

void spell_hydroperception(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	AFFECT_DATA af;

	if (is_affected(ch, sn))
	{
		send_to_char("Your eyes are already accommodated to seeing in water.\n\r", ch);
		return;
	}

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = get_spell_aftype(ch);
	af.type = sn;
	af.level = level;
	af.duration = level / 2;
	af.location = APPLY_NONE;
	af.modifier = 0;
	af.mod_name = MOD_PERCEPTION;
	affect_to_char(ch, &af);

	send_to_char("You focus your senses on changes in the water around you.\n\r", ch);
}